

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

bool winmd::reader::is_by_ref(byte_view *data)

{
  ElementType EVar1;
  undefined1 auStack_28 [7];
  ElementType element_type;
  byte_view cursor;
  byte_view *data_local;
  
  _auStack_28 = data->m_first;
  cursor.m_first = data->m_last;
  cursor.m_last = (uint8_t *)data;
  EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)auStack_28);
  if (EVar1 == ByRef) {
    *(uint8_t **)cursor.m_last = _auStack_28;
    *(uint8_t **)(cursor.m_last + 8) = cursor.m_first;
  }
  return EVar1 == ByRef;
}

Assistant:

inline bool is_by_ref(byte_view& data)
    {
        auto cursor = data;
        auto element_type = uncompress_enum<ElementType>(cursor);
        if (element_type == ElementType::ByRef)
        {
            data = cursor;
            return true;
        }
        else
        {
            XLANG_ASSERT(element_type != ElementType::TypedByRef);
            return false;
        }
    }